

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double t91;
  double t90;
  double t85;
  double t84;
  double t82;
  double t81;
  double t80;
  double t79;
  double t77;
  double t76;
  double t75;
  double t74;
  double t73;
  double t72;
  double t71;
  double t70;
  double t69;
  double t68;
  double t52;
  double t43;
  double t35;
  double t29;
  double t25;
  double t22;
  double t16;
  double t13;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t64;
  double t60;
  double t59;
  double t55;
  double t49;
  double t45;
  double t44;
  double t39;
  double t34;
  double t33;
  double t28;
  double t21;
  double t20;
  double t15;
  double t14;
  double t6;
  double t87;
  double t5;
  double t3;
  double t1;
  
  dVar1 = safe_math::cbrt<double>(9.88355597485705e-318);
  dVar2 = (1.0 / dVar1) * 2.519842099789747;
  dVar3 = (double)(-(ulong)(1.0 <= dVar2 * 0.9847450218426962 * 0.25) & 0x3ff0000000000000);
  dVar4 = safe_math::sqrt<double>(9.88450952155352e-318);
  dVar1 = (1.0 / dVar1) * 1.720508027656199;
  dVar5 = safe_math::log<double>(9.88522591673999e-318);
  dVar2 = dVar2 * dVar5;
  dVar6 = piecewise_functor_3<double>
                    ((bool)(-(dVar3 != 0.0) & 1),
                     -0.1423 / (dVar4 * 1.0529 * 0.5 + 1.0 + dVar1 * 0.4808460067404899 * 0.25),
                     dVar5 * 0.0311 + -0.048 + dVar2 * 0.0019694900436853925 * 0.25 +
                     dVar1 * -0.016730095015565934 * 0.25);
  dVar1 = piecewise_functor_3<double>
                    ((bool)(-(dVar3 != 0.0) & 1),
                     -0.0843 / (dVar4 * 1.3981 * 0.5 + 1.0 + dVar1 * 0.37657136280726433 * 0.25),
                     dVar5 * 0.01555 + -0.0269 + dVar2 * 0.0006893215152898874 * 0.25 +
                     dVar1 * -0.0069227979374755595 * 0.25);
  dVar2 = (in_XMM0_Qa - in_XMM1_Qa) * (1.0 / (in_XMM0_Qa + in_XMM1_Qa));
  dVar3 = dVar2 + 1.0;
  dVar4 = safe_math::cbrt<double>(9.88841264015567e-318);
  dVar5 = safe_math::cbrt<double>(9.88866461363505e-318);
  dVar3 = piecewise_functor_3<double>
                    ((bool)(-((double)(-(ulong)(dVar3 <= 1e-15) & 0x3ff0000000000000) != 0.0) & 1),
                     dVar4 * 1e-15,dVar5 * dVar3);
  dVar2 = 1.0 - dVar2;
  dVar5 = safe_math::cbrt<double>(9.8894304153861e-318);
  dVar4 = piecewise_functor_3<double>
                    ((double)(-(ulong)(dVar2 <= 1e-15) & 0x3ff0000000000000) != 0.0,dVar4 * 1e-15,
                     dVar5 * dVar2);
  *in_RDI = dVar6 + (dVar1 - dVar6) * ((dVar3 + dVar4) - 2.0) * 1.9236610509315362;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t87 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t14 = gamma_0;
    constexpr double t15 = beta1_0;
    constexpr double t20 = beta2_0 * t1;
    constexpr double t21 = t3 * t6;
    constexpr double t28 = a_0;
    constexpr double t33 = c_0 * t1;
    constexpr double t34 = t33 * t3;
    constexpr double t39 = d_0 * t1;
    constexpr double t44 = gamma_1;
    constexpr double t45 = beta1_1;
    constexpr double t49 = beta2_1 * t1;
    constexpr double t55 = a_1;
    constexpr double t59 = c_1 * t1;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = d_1 * t1;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t9 = 0.1e1 / t8;
    const double t10 = t6 * t9;
    const double t11 = t1 * t3 * t10;
    const double t12 = t11 / 0.4e1;
    const double t13 = 0.1e1 <= t12;
    const double t16 = safe_math::sqrt( t11 );
    const double t22 = t21 * t9;
    const double t25 = 0.1e1 + t15 * t16 / 0.2e1 + t20 * t22 / 0.4e1;
    const double t29 = safe_math::log( t12 );
    const double t35 = t10 * t29;
    const double t43 = piecewise_functor_3( t13, t14 / t25, t28 * t29 + b_0 + t34 * t35 / 0.4e1 + t39 * t22 / 0.4e1 );
    const double t52 = 0.1e1 + t45 * t16 / 0.2e1 + t49 * t22 / 0.4e1;
    const double t68 = piecewise_functor_3( t13, t44 / t52, t55 * t29 + b_1 + t60 * t35 / 0.4e1 + t64 * t22 / 0.4e1 );
    const double t69 = t68 - t43;
    const double t70 = rho_a - rho_b;
    const double t71 = 0.1e1 / t7;
    const double t72 = t70 * t71;
    const double t73 = 0.1e1 + t72;
    const double t74 = t73 <= zeta_tol;
    const double t75 = safe_math::cbrt( zeta_tol );
    const double t76 = t75 * zeta_tol;
    const double t77 = safe_math::cbrt( t73 );
    const double t79 = piecewise_functor_3( t74, t76, t77 * t73 );
    const double t80 = 0.1e1 - t72;
    const double t81 = t80 <= zeta_tol;
    const double t82 = safe_math::cbrt( t80 );
    const double t84 = piecewise_functor_3( t81, t76, t82 * t80 );
    const double t85 = t79 + t84 - 0.2e1;
    const double t90 = 0.1e1 / ( 0.2e1 * t87 - 0.2e1 );
    const double t91 = t69 * t85 * t90;


    eps = t43 + t91;

  }